

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pull.c
# Opt level: O3

void pull0_sock_close(void *arg)

{
  nni_aio *aio;
  
  nni_mtx_lock((nni_mtx *)((long)arg + 0x38));
  aio = (nni_aio *)nni_list_first((nni_list *)((long)arg + 0x20));
  while (aio != (nni_aio *)0x0) {
    nni_aio_list_remove(aio);
    nni_aio_finish_error(aio,NNG_ECLOSED);
    aio = (nni_aio *)nni_list_first((nni_list *)((long)arg + 0x20));
  }
  nni_mtx_unlock((nni_mtx *)((long)arg + 0x38));
  return;
}

Assistant:

static void
pull0_sock_close(void *arg)
{
	pull0_sock *s = arg;
	nni_aio    *a;
	nni_mtx_lock(&s->m);
	while ((a = nni_list_first(&s->rq)) != NULL) {
		nni_aio_list_remove(a);
		nni_aio_finish_error(a, NNG_ECLOSED);
	}
	// NB: The common socket framework closes pipes before this.
	nni_mtx_unlock(&s->m);
}